

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void d68000_cmpm_16(m68k_info *info)

{
  int in_EDX;
  
  build_pi_pi(info,2,in_EDX);
  return;
}

Assistant:

static void d68000_cmpm_16(m68k_info *info)
{
	build_pi_pi(info, M68K_INS_CMPM, 2);
}